

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinja2CppLight.h
# Opt level: O2

string * __thiscall
Jinja2CppLight::TupleValue::render_abi_cxx11_(string *__return_storage_ptr__,TupleValue *this)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  pointer psVar4;
  allocator<char> local_51;
  string local_50 [32];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"{",(allocator<char> *)local_50);
  psVar1 = (this->values).
           super__Vector_base<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  for (psVar4 = (this->values).
                super__Vector_base<std::shared_ptr<Jinja2CppLight::Value>,_std::allocator<std::shared_ptr<Jinja2CppLight::Value>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    if (!bVar3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    peVar2 = (psVar4->super___shared_ptr<Jinja2CppLight::Value,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (peVar2 == (element_type *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>(local_50,"<empty>",&local_51);
    }
    else {
      (*peVar2->_vptr_Value[2])(local_50,peVar2);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string(local_50);
    bVar3 = false;
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string render() {
        std::string result = "{";
        bool isFirst = true;

        for (auto& val : values) {
            if (isFirst)
                isFirst = false;
            else
                result += ", ";

            result += val ? val->render() : "<empty>";
        }

        result += "}";
        return result;
    }